

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_compare.cpp
# Opt level: O0

bool Omega_h::CompareArrays<signed_char>::compare
               (CommPtr *comm,Read<signed_char> *a,Read<signed_char> *b,VarCompareOpts opts,
               Int ncomps,Int dim,bool verbose)

{
  void **this;
  char cVar1;
  bool bVar2;
  LO LVar3;
  int iVar4;
  I32 IVar5;
  element_type *peVar6;
  long lVar7;
  char *pcVar8;
  ostream *poVar9;
  long lVar10;
  long lVar11;
  long comp;
  long global_ent;
  long global_comp;
  LO j;
  int best_rank;
  I32 rank_cand;
  long global_start;
  undefined1 local_98 [8];
  HostRead<signed_char> h_b;
  undefined1 local_78 [8];
  HostRead<signed_char> h_a;
  Read<signed_char> local_58;
  Read<signed_char> local_48;
  byte local_32;
  byte local_31;
  Int local_30;
  bool this_rank_matches;
  Int IStack_2c;
  bool verbose_local;
  Int dim_local;
  Int ncomps_local;
  Read<signed_char> *b_local;
  Read<signed_char> *a_local;
  CommPtr *comm_local;
  
  if (opts.type == NONE) {
    comm_local._7_1_ = 1;
  }
  else {
    local_31 = verbose;
    local_30 = dim;
    IStack_2c = ncomps;
    _dim_local = b;
    b_local = a;
    a_local = (Read<signed_char> *)comm;
    Read<signed_char>::Read(&local_48,a);
    Read<signed_char>::Read(&local_58,b);
    bVar2 = Omega_h::operator==(&local_48,&local_58);
    Read<signed_char>::~Read(&local_58);
    Read<signed_char>::~Read(&local_48);
    local_32 = bVar2;
    peVar6 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
             operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)comm);
    bVar2 = Comm::reduce_and(peVar6,(bool)(local_32 & 1));
    if (bVar2) {
      comm_local._7_1_ = 1;
    }
    else if ((local_31 & 1) == 0) {
      comm_local._7_1_ = 0;
    }
    else {
      this = &h_b.read_.write_.shared_alloc_.direct_ptr;
      Read<signed_char>::Read((Read<signed_char> *)this,a);
      HostRead<signed_char>::HostRead((HostRead<signed_char> *)local_78,(Read<signed_char> *)this);
      Read<signed_char>::~Read((Read<signed_char> *)&h_b.read_.write_.shared_alloc_.direct_ptr);
      Read<signed_char>::Read((Read<signed_char> *)&global_start,b);
      HostRead<signed_char>::HostRead
                ((HostRead<signed_char> *)local_98,(Read<signed_char> *)&global_start);
      Read<signed_char>::~Read((Read<signed_char> *)&global_start);
      peVar6 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)comm);
      LVar3 = HostRead<signed_char>::size((HostRead<signed_char> *)local_78);
      lVar7 = Comm::exscan<long>(peVar6,(long)LVar3,OMEGA_H_SUM);
      j = 0x7fffffff;
      if ((local_32 & 1) == 0) {
        peVar6 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
                 operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                             *)comm);
        j = Comm::rank(peVar6);
      }
      peVar6 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)comm);
      iVar4 = Comm::allreduce<int>(peVar6,j,OMEGA_H_MIN);
      peVar6 = std::__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
               operator->((__shared_ptr_access<Omega_h::Comm,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                           *)comm);
      IVar5 = Comm::rank(peVar6);
      if (IVar5 == iVar4) {
        for (global_comp._4_4_ = 0;
            LVar3 = HostRead<signed_char>::size((HostRead<signed_char> *)local_78),
            global_comp._4_4_ < LVar3; global_comp._4_4_ = global_comp._4_4_ + 1) {
          pcVar8 = HostRead<signed_char>::operator[]
                             ((HostRead<signed_char> *)local_78,global_comp._4_4_);
          cVar1 = *pcVar8;
          pcVar8 = HostRead<signed_char>::operator[]
                             ((HostRead<signed_char> *)local_98,global_comp._4_4_);
          if (cVar1 != *pcVar8) {
            lVar10 = (long)IStack_2c;
            lVar11 = (long)IStack_2c;
            pcVar8 = dimensional_singular_name(local_30);
            poVar9 = std::operator<<((ostream *)&std::cout,pcVar8);
            poVar9 = std::operator<<(poVar9,' ');
            poVar9 = (ostream *)
                     std::ostream::operator<<(poVar9,(lVar7 + global_comp._4_4_) / lVar10);
            poVar9 = std::operator<<(poVar9," comp ");
            poVar9 = (ostream *)
                     std::ostream::operator<<(poVar9,(lVar7 + global_comp._4_4_) % lVar11);
            poVar9 = std::operator<<(poVar9," ");
            pcVar8 = HostRead<signed_char>::operator[]
                               ((HostRead<signed_char> *)local_78,global_comp._4_4_);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,(long)*pcVar8);
            poVar9 = std::operator<<(poVar9," != ");
            pcVar8 = HostRead<signed_char>::operator[]
                               ((HostRead<signed_char> *)local_98,global_comp._4_4_);
            poVar9 = (ostream *)std::ostream::operator<<(poVar9,(long)*pcVar8);
            std::operator<<(poVar9,'\n');
            break;
          }
        }
      }
      comm_local._7_1_ = 0;
      HostRead<signed_char>::~HostRead((HostRead<signed_char> *)local_98);
      HostRead<signed_char>::~HostRead((HostRead<signed_char> *)local_78);
    }
  }
  return (bool)(comm_local._7_1_ & 1);
}

Assistant:

static bool compare(CommPtr comm, Read<T> a, Read<T> b, VarCompareOpts opts,
      Int ncomps, Int dim, bool verbose) {
    if (opts.type == VarCompareOpts::NONE) return true;
    auto this_rank_matches = (a == b);
    if (comm->reduce_and(this_rank_matches)) return true;
    if (!verbose) return false;
    /* if integer arrays are different, we find the first mismatching
       value and print it out as a place for users to start
       tracking down the issue */
    auto h_a = HostRead<T>(a);
    auto h_b = HostRead<T>(b);
    auto global_start = comm->exscan(GO(h_a.size()), OMEGA_H_SUM);
    I32 rank_cand = ArithTraits<I32>::max();
    if (!this_rank_matches) rank_cand = comm->rank();
    // only the first mismatching rank prints
    auto best_rank = comm->allreduce(rank_cand, OMEGA_H_MIN);
    if (comm->rank() == best_rank) {
      for (LO j = 0; j < h_a.size(); ++j) {
        // and it only prints its first mismatching value
        if (h_a[j] != h_b[j]) {
          auto global_comp = global_start + GO(j);
          auto global_ent = global_comp / ncomps;
          auto comp = global_comp % ncomps;
          std::cout << dimensional_singular_name(dim) << ' ' << global_ent
                    << " comp " << comp << " " << I64(h_a[j])
                    << " != " << I64(h_b[j]) << '\n';
          break;
        }
      }
    }
    return false;
  }